

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::ClassNameWithoutPackage_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ServiceDescriptor *descriptor,
          bool immutable)

{
  string *full_name_00;
  FileDescriptor *file;
  long lVar1;
  LogMessage *other;
  LogFinisher local_66;
  byte local_65;
  LogMessage local_58;
  undefined1 local_1a;
  byte local_19;
  _anonymous_namespace_ *p_Stack_18;
  bool immutable_local;
  ServiceDescriptor *descriptor_local;
  string *full_name;
  
  local_19 = (byte)descriptor & 1;
  local_1a = 0;
  p_Stack_18 = this;
  descriptor_local = (ServiceDescriptor *)__return_storage_ptr__;
  full_name_00 = ServiceDescriptor::full_name_abi_cxx11_((ServiceDescriptor *)this);
  file = ServiceDescriptor::file((ServiceDescriptor *)p_Stack_18);
  anon_unknown_0::StripPackageName(__return_storage_ptr__,full_name_00,file);
  lVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
  local_65 = 0;
  if (lVar1 != -1) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_name_resolver.cc"
               ,0x5a);
    local_65 = 1;
    other = internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: full_name.find(\'.\') == string::npos: ");
    internal::LogFinisher::operator=(&local_66,other);
  }
  if ((local_65 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

string ClassNameWithoutPackage(const ServiceDescriptor* descriptor,
                               bool immutable) {
  string full_name = StripPackageName(descriptor->full_name(),
                                      descriptor->file());
  // We don't allow nested service definitions.
  GOOGLE_CHECK(full_name.find('.') == string::npos);
  return full_name;
}